

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  ushort uVar1;
  stbi_uc *psVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ushort uVar10;
  uint uVar11;
  byte *pbVar12;
  uint uVar13;
  stbi_uc sVar14;
  stbi_uc *psVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_00101949:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_length;
    iVar5 = 0;
    do {
      if (iVar5 < 1) {
        uVar13 = a->code_buffer;
        pbVar12 = a->zbuffer;
        iVar19 = iVar5;
        do {
          uVar11 = 0;
          pbVar17 = pbVar12;
          if (pbVar12 < a->zbuffer_end) {
            pbVar17 = pbVar12 + 1;
            a->zbuffer = pbVar17;
            uVar11 = (uint)*pbVar12;
          }
          uVar13 = uVar13 | uVar11 << ((byte)iVar19 & 0x1f);
          a->code_buffer = uVar13;
          iVar5 = iVar19 + 8;
          a->num_bits = iVar5;
          bVar3 = iVar19 < 0x11;
          pbVar12 = pbVar17;
          iVar19 = iVar5;
        } while (bVar3);
      }
      else {
        uVar13 = a->code_buffer;
      }
      uVar21 = uVar13 >> 1;
      a->code_buffer = uVar21;
      uVar11 = iVar5 - 1;
      a->num_bits = uVar11;
      if (uVar11 < 2) {
        pbVar12 = a->zbuffer;
        iVar5 = iVar5 + -9;
        do {
          iVar19 = iVar5;
          uVar11 = 0;
          pbVar17 = pbVar12;
          if (pbVar12 < a->zbuffer_end) {
            pbVar17 = pbVar12 + 1;
            a->zbuffer = pbVar17;
            uVar11 = (uint)*pbVar12;
          }
          iVar5 = iVar19 + 8;
          uVar21 = uVar21 | uVar11 << ((byte)iVar5 & 0x1f);
          a->code_buffer = uVar21;
          a->num_bits = iVar19 + 0x10;
          pbVar12 = pbVar17;
        } while (iVar5 < 0x11);
        uVar11 = iVar19 + 0x10;
      }
      uVar22 = uVar21 >> 2;
      a->code_buffer = uVar22;
      uVar6 = uVar11 - 2;
      a->num_bits = uVar6;
      switch(uVar21 & 3) {
      case 0:
        if ((uVar6 & 7) != 0) {
          uVar22 = uVar22 >> (sbyte)(uVar6 & 7);
          a->code_buffer = uVar22;
          uVar6 = uVar6 & 0xfffffff8;
          a->num_bits = uVar6;
        }
        if ((int)uVar6 < 1) {
          uVar16 = 0;
LAB_0010233f:
          psVar15 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          do {
            if (psVar15 < psVar2) {
              a->zbuffer = psVar15 + 1;
              sVar14 = *psVar15;
              psVar15 = psVar15 + 1;
            }
            else {
              sVar14 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar16) = sVar14;
            uVar16 = uVar16 + 1;
          } while (uVar16 != 4);
        }
        else {
          uVar11 = uVar6 - 1 >> 3;
          uVar16 = (ulong)(uVar11 + 1);
          uVar18 = 0xffffffffffffffff;
          do {
            *(char *)((long)local_814.fast + uVar18 + 1) = (char)uVar22;
            uVar22 = uVar22 >> 8;
            uVar18 = uVar18 + 1;
          } while (uVar11 != uVar18);
          a->code_buffer = uVar22;
          a->num_bits = (uVar6 - (uVar6 - 1 & 0xfffffff8)) + -8;
          if (uVar18 < 3) goto LAB_0010233f;
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) {
          stbi__g_failure_reason = "zlib corrupt";
          return 0;
        }
        psVar15 = a->zbuffer;
        uVar16 = (ulong)local_814.fast[0];
        if (a->zbuffer_end < psVar15 + uVar16) {
          stbi__g_failure_reason = "read past buffer";
          return 0;
        }
        if (a->zout_end < obuf + uVar16) {
          iVar5 = stbi__zexpand(a,obuf,(uint)local_814.fast[0]);
          if (iVar5 == 0) {
            return 0;
          }
          psVar15 = a->zbuffer;
          obuf = a->zout;
        }
        memcpy(obuf,psVar15,uVar16);
        a->zbuffer = a->zbuffer + uVar16;
        obuf = a->zout + uVar16;
        a->zout = obuf;
        goto LAB_001023ea;
      case 1:
        iVar5 = stbi__zbuild_huffman
                          (z,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                           ,0x120);
        if (iVar5 == 0) {
          return 0;
        }
        psVar15 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar19 = 0x20;
        break;
      case 2:
        if (uVar6 < 5) {
          pbVar12 = a->zbuffer;
          iVar5 = uVar11 - 10;
          do {
            iVar19 = iVar5;
            uVar11 = 0;
            pbVar17 = pbVar12;
            if (pbVar12 < a->zbuffer_end) {
              pbVar17 = pbVar12 + 1;
              a->zbuffer = pbVar17;
              uVar11 = (uint)*pbVar12;
            }
            iVar5 = iVar19 + 8;
            uVar22 = uVar22 | uVar11 << ((byte)iVar5 & 0x1f);
            a->code_buffer = uVar22;
            a->num_bits = iVar19 + 0x10;
            pbVar12 = pbVar17;
          } while (iVar5 < 0x11);
          uVar6 = iVar19 + 0x10;
        }
        uVar21 = uVar22 >> 5;
        a->code_buffer = uVar21;
        uVar11 = uVar6 - 5;
        a->num_bits = uVar11;
        if (uVar11 < 5) {
          pbVar12 = a->zbuffer;
          iVar5 = uVar6 - 0xd;
          do {
            iVar19 = iVar5;
            uVar11 = 0;
            pbVar17 = pbVar12;
            if (pbVar12 < a->zbuffer_end) {
              pbVar17 = pbVar12 + 1;
              a->zbuffer = pbVar17;
              uVar11 = (uint)*pbVar12;
            }
            iVar5 = iVar19 + 8;
            uVar21 = uVar21 | uVar11 << ((byte)iVar5 & 0x1f);
            a->code_buffer = uVar21;
            a->num_bits = iVar19 + 0x10;
            pbVar12 = pbVar17;
          } while (iVar5 < 0x11);
          uVar11 = iVar19 + 0x10;
        }
        uVar7 = uVar21 >> 5;
        a->code_buffer = uVar7;
        uVar6 = uVar11 - 5;
        a->num_bits = uVar6;
        if (uVar6 < 4) {
          pbVar12 = a->zbuffer;
          iVar5 = uVar11 - 0xd;
          do {
            iVar19 = iVar5;
            uVar11 = 0;
            pbVar17 = pbVar12;
            if (pbVar12 < a->zbuffer_end) {
              pbVar17 = pbVar12 + 1;
              a->zbuffer = pbVar17;
              uVar11 = (uint)*pbVar12;
            }
            iVar5 = iVar19 + 8;
            uVar7 = uVar7 | uVar11 << ((byte)iVar5 & 0x1f);
            a->code_buffer = uVar7;
            a->num_bits = iVar19 + 0x10;
            pbVar12 = pbVar17;
          } while (iVar5 < 0x11);
          uVar6 = iVar19 + 0x10;
        }
        uVar22 = (uVar22 & 0x1f) + 0x101;
        iVar19 = (uVar21 & 0x1f) + 1;
        uVar11 = uVar7 >> 4;
        a->code_buffer = uVar11;
        iVar5 = uVar6 - 4;
        a->num_bits = iVar5;
        local_a08[0] = 0;
        local_a08[1] = 0;
        local_a08[2] = 0;
        local_a08[3] = 0;
        local_a08[4] = 0;
        local_a08[5] = 0;
        local_a08[6] = 0;
        local_a08[7] = 0;
        local_a08[8] = 0;
        local_a08[9] = 0;
        local_a08[10] = 0;
        local_a08[0xb] = 0;
        local_a08[0xc] = 0;
        local_a08[0xd] = 0;
        local_a08[0xe] = 0;
        local_a08[0xf] = 0;
        local_a08[0x10] = 0;
        local_a08[0x11] = 0;
        local_a08[0x12] = 0;
        uVar16 = 0;
        do {
          uVar21 = uVar11;
          if (iVar5 < 3) {
            pbVar12 = a->zbuffer;
            iVar20 = iVar5;
            do {
              uVar11 = 0;
              pbVar17 = pbVar12;
              if (pbVar12 < a->zbuffer_end) {
                pbVar17 = pbVar12 + 1;
                a->zbuffer = pbVar17;
                uVar11 = (uint)*pbVar12;
              }
              uVar21 = uVar21 | uVar11 << ((byte)iVar20 & 0x1f);
              a->code_buffer = uVar21;
              iVar5 = iVar20 + 8;
              a->num_bits = iVar5;
              bVar3 = iVar20 < 0x11;
              pbVar12 = pbVar17;
              iVar20 = iVar5;
            } while (bVar3);
          }
          uVar11 = uVar21 >> 3;
          a->code_buffer = uVar11;
          iVar5 = iVar5 + -3;
          a->num_bits = iVar5;
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar16]] =
               (byte)uVar21 & 7;
          uVar16 = uVar16 + 1;
        } while (uVar16 != (uVar7 & 0xf) + 4);
        iVar5 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar5 == 0) {
          return 0;
        }
        iVar20 = iVar19 + uVar22;
        iVar5 = a->num_bits;
        iVar23 = 0;
        do {
          if (iVar5 < 0x10) {
            uVar11 = a->code_buffer;
            pbVar12 = a->zbuffer;
            iVar24 = iVar5;
            do {
              uVar21 = 0;
              pbVar17 = pbVar12;
              if (pbVar12 < a->zbuffer_end) {
                pbVar17 = pbVar12 + 1;
                a->zbuffer = pbVar17;
                uVar21 = (uint)*pbVar12;
              }
              uVar11 = uVar11 | uVar21 << ((byte)iVar24 & 0x1f);
              a->code_buffer = uVar11;
              iVar5 = iVar24 + 8;
              a->num_bits = iVar5;
              bVar3 = iVar24 < 0x11;
              pbVar12 = pbVar17;
              iVar24 = iVar5;
            } while (bVar3);
          }
          else {
            uVar11 = a->code_buffer;
          }
          uVar10 = local_814.fast[uVar11 & 0x1ff];
          if (uVar10 == 0) {
            uVar10 = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
            uVar21 = (uVar10 & 0xf0f) << 4 | (uVar10 & 0xf0f0) >> 4;
            uVar21 = (uVar21 >> 2 & 0x3333) + (uVar21 & 0x3333) * 4;
            uVar21 = (uVar21 >> 1 & 0x5555) + (uVar21 & 0x5555) * 2;
            lVar8 = 0;
            do {
              lVar9 = lVar8;
              lVar8 = lVar9 + 1;
            } while (local_814.maxcode[lVar9 + 10] <= (int)uVar21);
            if (lVar8 == 7) goto LAB_001023f8;
            uVar10 = local_814.firstcode[lVar9 + 10];
            uVar1 = local_814.firstsymbol[lVar9 + 10];
            uVar11 = uVar11 >> ((char)lVar9 + 10U & 0x1f);
            a->code_buffer = uVar11;
            iVar5 = (iVar5 - (int)lVar8) + -9;
            a->num_bits = iVar5;
            uVar10 = *(ushort *)
                      ((long)&local_814 +
                      ((ulong)uVar1 + ((ulong)(uVar21 >> (7U - (char)lVar8 & 0x1f)) - (ulong)uVar10)
                      ) * 2 + 0x5a4);
          }
          else {
            uVar11 = uVar11 >> ((byte)(uVar10 >> 9) & 0x1f);
            a->code_buffer = uVar11;
            iVar5 = iVar5 - (uint)(uVar10 >> 9);
            a->num_bits = iVar5;
            uVar10 = uVar10 & 0x1ff;
          }
          if (0x12 < uVar10) goto LAB_001023f8;
          if (uVar10 < 0x10) {
            lVar8 = (long)iVar23;
            iVar23 = iVar23 + 1;
            local_9e8[lVar8] = (char)uVar10;
          }
          else {
            if (uVar10 == 0x11) {
              if (iVar5 < 3) {
                pbVar12 = a->zbuffer;
                iVar24 = iVar5;
                do {
                  uVar21 = 0;
                  pbVar17 = pbVar12;
                  if (pbVar12 < a->zbuffer_end) {
                    pbVar17 = pbVar12 + 1;
                    a->zbuffer = pbVar17;
                    uVar21 = (uint)*pbVar12;
                  }
                  uVar11 = uVar11 | uVar21 << ((byte)iVar24 & 0x1f);
                  a->code_buffer = uVar11;
                  iVar5 = iVar24 + 8;
                  a->num_bits = iVar5;
                  bVar3 = iVar24 < 0x11;
                  pbVar12 = pbVar17;
                  iVar24 = iVar5;
                } while (bVar3);
              }
              a->code_buffer = uVar11 >> 3;
              iVar5 = iVar5 + -3;
              a->num_bits = iVar5;
              uVar11 = (uVar11 & 7) + 3;
LAB_00101ee4:
              uVar21 = 0;
            }
            else {
              if (uVar10 != 0x10) {
                if (iVar5 < 7) {
                  pbVar12 = a->zbuffer;
                  iVar24 = iVar5;
                  do {
                    uVar21 = 0;
                    pbVar17 = pbVar12;
                    if (pbVar12 < a->zbuffer_end) {
                      pbVar17 = pbVar12 + 1;
                      a->zbuffer = pbVar17;
                      uVar21 = (uint)*pbVar12;
                    }
                    uVar11 = uVar11 | uVar21 << ((byte)iVar24 & 0x1f);
                    a->code_buffer = uVar11;
                    iVar5 = iVar24 + 8;
                    a->num_bits = iVar5;
                    bVar3 = iVar24 < 0x11;
                    pbVar12 = pbVar17;
                    iVar24 = iVar5;
                  } while (bVar3);
                }
                a->code_buffer = uVar11 >> 7;
                iVar5 = iVar5 + -7;
                a->num_bits = iVar5;
                uVar11 = (uVar11 & 0x7f) + 0xb;
                goto LAB_00101ee4;
              }
              if (iVar5 < 2) {
                pbVar12 = a->zbuffer;
                iVar24 = iVar5;
                do {
                  uVar21 = 0;
                  pbVar17 = pbVar12;
                  if (pbVar12 < a->zbuffer_end) {
                    pbVar17 = pbVar12 + 1;
                    a->zbuffer = pbVar17;
                    uVar21 = (uint)*pbVar12;
                  }
                  uVar11 = uVar11 | uVar21 << ((byte)iVar24 & 0x1f);
                  a->code_buffer = uVar11;
                  iVar5 = iVar24 + 8;
                  a->num_bits = iVar5;
                  bVar3 = iVar24 < 0x11;
                  pbVar12 = pbVar17;
                  iVar24 = iVar5;
                } while (bVar3);
              }
              a->code_buffer = uVar11 >> 2;
              iVar5 = iVar5 + -2;
              a->num_bits = iVar5;
              if (iVar23 == 0) goto LAB_001023f8;
              uVar11 = (uVar11 & 3) + 3;
              uVar21 = (uint)(&bStack_9e9)[iVar23];
            }
            if (iVar20 - iVar23 < (int)uVar11) goto LAB_001023f8;
            memset(local_9e8 + iVar23,uVar21,(ulong)uVar11);
            iVar23 = iVar23 + uVar11;
          }
        } while (iVar23 < iVar20);
        if (iVar23 != iVar20) {
LAB_001023f8:
          stbi__g_failure_reason = "bad codelengths";
          return 0;
        }
        iVar5 = stbi__zbuild_huffman(z,local_9e8,uVar22);
        if (iVar5 == 0) {
          return 0;
        }
        psVar15 = local_9e8 + uVar22;
        break;
      case 3:
        goto switchD_00101a1c_caseD_3;
      }
      iVar5 = stbi__zbuild_huffman(&a->z_distance,psVar15,iVar19);
      if (iVar5 == 0) {
        return 0;
      }
      obuf = a->zout;
      while( true ) {
        while( true ) {
          iVar5 = a->num_bits;
          if (iVar5 < 0x10) {
            uVar11 = a->code_buffer;
            pbVar12 = a->zbuffer;
            iVar19 = iVar5;
            do {
              uVar21 = 0;
              pbVar17 = pbVar12;
              if (pbVar12 < a->zbuffer_end) {
                pbVar17 = pbVar12 + 1;
                a->zbuffer = pbVar17;
                uVar21 = (uint)*pbVar12;
              }
              uVar11 = uVar11 | uVar21 << ((byte)iVar19 & 0x1f);
              a->code_buffer = uVar11;
              iVar5 = iVar19 + 8;
              a->num_bits = iVar5;
              bVar3 = iVar19 < 0x11;
              pbVar12 = pbVar17;
              iVar19 = iVar5;
            } while (bVar3);
          }
          else {
            uVar11 = a->code_buffer;
          }
          uVar10 = z->fast[uVar11 & 0x1ff];
          if (uVar10 == 0) {
            uVar10 = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
            uVar21 = (uVar10 & 0xf0f) << 4 | (uVar10 & 0xf0f0) >> 4;
            uVar21 = (uVar21 >> 2 & 0x3333) + (uVar21 & 0x3333) * 4;
            uVar21 = (uVar21 >> 1 & 0x5555) + (uVar21 & 0x5555) * 2;
            lVar8 = 0;
            do {
              lVar9 = lVar8;
              lVar8 = lVar9 + 1;
            } while ((a->z_length).maxcode[lVar9 + 10] <= (int)uVar21);
            if (lVar8 == 7) goto LAB_0010240a;
            uVar10 = (a->z_length).firstcode[lVar9 + 10];
            uVar1 = (a->z_length).firstsymbol[lVar9 + 10];
            uVar11 = uVar11 >> ((char)lVar9 + 10U & 0x1f);
            a->code_buffer = uVar11;
            iVar5 = (iVar5 - (int)lVar8) + -9;
            a->num_bits = iVar5;
            uVar21 = (uint)*(ushort *)
                            ((long)a +
                            ((ulong)uVar1 +
                            ((ulong)(uVar21 >> (7U - (char)lVar8 & 0x1f)) - (ulong)uVar10)) * 2 +
                            0x5d8);
          }
          else {
            uVar11 = uVar11 >> ((byte)(uVar10 >> 9) & 0x1f);
            a->code_buffer = uVar11;
            iVar5 = iVar5 - (uint)(uVar10 >> 9);
            a->num_bits = iVar5;
            uVar21 = uVar10 & 0x1ff;
          }
          if (0xff < uVar21) break;
          if (a->zout_end <= obuf) {
            iVar5 = stbi__zexpand(a,obuf,1);
            if (iVar5 == 0) {
              return 0;
            }
            obuf = a->zout;
          }
          *obuf = (char)uVar21;
          obuf = obuf + 1;
        }
        if (uVar21 == 0x100) break;
        uVar16 = (ulong)(uVar21 - 0x101);
        uVar21 = stbi__zlength_base[uVar16];
        if (0xffffffffffffffeb < uVar16 - 0x1c) {
          iVar19 = stbi__zlength_extra[uVar16];
          if (iVar5 < iVar19) {
            pbVar12 = a->zbuffer;
            iVar20 = iVar5;
            do {
              uVar6 = 0;
              pbVar17 = pbVar12;
              if (pbVar12 < a->zbuffer_end) {
                pbVar17 = pbVar12 + 1;
                a->zbuffer = pbVar17;
                uVar6 = (uint)*pbVar12;
              }
              uVar11 = uVar11 | uVar6 << ((byte)iVar20 & 0x1f);
              a->code_buffer = uVar11;
              iVar5 = iVar20 + 8;
              a->num_bits = iVar5;
              bVar3 = iVar20 < 0x11;
              pbVar12 = pbVar17;
              iVar20 = iVar5;
            } while (bVar3);
          }
          uVar6 = ~(-1 << ((byte)iVar19 & 0x1f)) & uVar11;
          uVar11 = uVar11 >> ((byte)iVar19 & 0x1f);
          a->code_buffer = uVar11;
          iVar5 = iVar5 - iVar19;
          a->num_bits = iVar5;
          uVar21 = uVar21 + uVar6;
        }
        if (iVar5 < 0x10) {
          pbVar12 = a->zbuffer;
          iVar19 = iVar5;
          do {
            uVar6 = 0;
            pbVar17 = pbVar12;
            if (pbVar12 < a->zbuffer_end) {
              pbVar17 = pbVar12 + 1;
              a->zbuffer = pbVar17;
              uVar6 = (uint)*pbVar12;
            }
            uVar11 = uVar11 | uVar6 << ((byte)iVar19 & 0x1f);
            a->code_buffer = uVar11;
            iVar5 = iVar19 + 8;
            a->num_bits = iVar5;
            bVar3 = iVar19 < 0x11;
            pbVar12 = pbVar17;
            iVar19 = iVar5;
          } while (bVar3);
        }
        uVar10 = (a->z_distance).fast[uVar11 & 0x1ff];
        if (uVar10 == 0) {
          uVar10 = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
          uVar6 = (uVar10 & 0xf0f) << 4 | (uVar10 & 0xf0f0) >> 4;
          uVar6 = (uVar6 >> 2 & 0x3333) + (uVar6 & 0x3333) * 4;
          uVar6 = (uVar6 >> 1 & 0x5555) + (uVar6 & 0x5555) * 2;
          lVar8 = 0;
          do {
            lVar9 = lVar8;
            lVar8 = lVar9 + 1;
          } while ((a->z_distance).maxcode[lVar9 + 10] <= (int)uVar6);
          if (lVar8 == 7) {
LAB_0010240a:
            stbi__g_failure_reason = "bad huffman code";
            return 0;
          }
          uVar10 = (a->z_distance).firstcode[lVar9 + 10];
          uVar1 = (a->z_distance).firstsymbol[lVar9 + 10];
          uVar11 = uVar11 >> ((char)lVar9 + 10U & 0x1f);
          a->code_buffer = uVar11;
          iVar5 = (iVar5 - (int)lVar8) + -9;
          a->num_bits = iVar5;
          uVar6 = (uint)*(ushort *)
                         ((long)a +
                         ((ulong)uVar1 +
                         ((ulong)(uVar6 >> (7U - (char)lVar8 & 0x1f)) - (ulong)uVar10)) * 2 + 0xdbc)
          ;
        }
        else {
          uVar11 = uVar11 >> ((byte)(uVar10 >> 9) & 0x1f);
          a->code_buffer = uVar11;
          iVar5 = iVar5 - (uint)(uVar10 >> 9);
          a->num_bits = iVar5;
          uVar6 = uVar10 & 0x1ff;
        }
        uVar16 = (ulong)uVar6;
        iVar19 = stbi__zdist_base[uVar16];
        if (0xffffffffffffffe5 < uVar16 - 0x1e) {
          iVar20 = stbi__zdist_extra[uVar16];
          if (iVar5 < iVar20) {
            pbVar12 = a->zbuffer;
            iVar23 = iVar5;
            do {
              uVar6 = 0;
              pbVar17 = pbVar12;
              if (pbVar12 < a->zbuffer_end) {
                pbVar17 = pbVar12 + 1;
                a->zbuffer = pbVar17;
                uVar6 = (uint)*pbVar12;
              }
              uVar11 = uVar11 | uVar6 << ((byte)iVar23 & 0x1f);
              a->code_buffer = uVar11;
              iVar5 = iVar23 + 8;
              a->num_bits = iVar5;
              bVar3 = iVar23 < 0x11;
              pbVar12 = pbVar17;
              iVar23 = iVar5;
            } while (bVar3);
          }
          a->code_buffer = uVar11 >> ((byte)iVar20 & 0x1f);
          a->num_bits = iVar5 - iVar20;
          iVar19 = iVar19 + (~(-1 << ((byte)iVar20 & 0x1f)) & uVar11);
        }
        if ((long)obuf - (long)a->zout_start < (long)iVar19) {
          stbi__g_failure_reason = "bad dist";
          return 0;
        }
        if (a->zout_end < obuf + (int)uVar21) {
          iVar5 = stbi__zexpand(a,obuf,uVar21);
          if (iVar5 == 0) {
            return 0;
          }
          obuf = a->zout;
        }
        lVar8 = -(long)iVar19;
        if (iVar19 == 1) {
          if (uVar21 != 0) {
            memset(obuf,(uint)(byte)obuf[lVar8],(ulong)uVar21);
            obuf = obuf + (ulong)(uVar21 - 1) + 1;
          }
        }
        else {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            *obuf = obuf[lVar8];
            obuf = obuf + 1;
          }
        }
      }
      a->zout = obuf;
LAB_001023ea:
      if ((uVar13 & 1) != 0) {
        return 1;
      }
      iVar5 = a->num_bits;
    } while( true );
  }
  pbVar12 = a->zbuffer;
  uVar10 = 0;
  if (pbVar12 < a->zbuffer_end) {
    a->zbuffer = pbVar12 + 1;
    bVar4 = *pbVar12;
    pbVar12 = pbVar12 + 1;
  }
  else {
    bVar4 = 0;
  }
  if (pbVar12 < a->zbuffer_end) {
    a->zbuffer = pbVar12 + 1;
    uVar10 = (ushort)*pbVar12;
  }
  if ((ushort)(((ushort)bVar4 << 8 | uVar10) * 0x7bdf) < 0x843) {
    if ((uVar10 & 0x20) == 0) {
      if ((bVar4 & 0xf) == 8) goto LAB_00101949;
      stbi__g_failure_reason = "bad compression";
    }
    else {
      stbi__g_failure_reason = "no preset dict";
    }
  }
  else {
    stbi__g_failure_reason = "bad zlib header";
  }
switchD_00101a1c_caseD_3:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}